

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerVariablesHelper.cxx
# Opt level: O0

Dummies * CreateDummies(Dummies *__return_storage_ptr__,string *targetName,
                       string *currentSourceDirectory,string *currentBinaryDirectory)

{
  element_type *this;
  element_type *this_00;
  cmStateSnapshot local_f8;
  cmStateDirectory local_e0;
  cmStateDirectory local_b8;
  undefined1 local_90 [8];
  cmStateSnapshot snapshot;
  shared_ptr<cmGlobalGenerator> local_70;
  cmState *local_60;
  cmState *state;
  undefined4 local_48;
  Mode local_44;
  shared_ptr<cmake> local_40;
  undefined1 local_29;
  string *local_28;
  string *currentBinaryDirectory_local;
  string *currentSourceDirectory_local;
  string *targetName_local;
  Dummies *dummies;
  
  local_29 = 0;
  local_28 = currentBinaryDirectory;
  currentBinaryDirectory_local = currentSourceDirectory;
  currentSourceDirectory_local = targetName;
  targetName_local = (string *)__return_storage_ptr__;
  Dummies::Dummies(__return_storage_ptr__);
  local_44 = Script;
  local_48 = 1;
  std::make_shared<cmake,cmake::Role,cmState::Mode>((Role *)&local_40,&local_44);
  std::shared_ptr<cmake>::operator=(&__return_storage_ptr__->CMake,&local_40);
  std::shared_ptr<cmake>::~shared_ptr(&local_40);
  this = std::__shared_ptr_access<cmake,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<cmake,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    __return_storage_ptr__);
  local_60 = cmake::GetState(this);
  snapshot.Position.Position =
       (PositionType)
       std::__shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>::get
                 ((__shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__);
  std::make_shared<cmGlobalGenerator,cmake*>((cmake **)&local_70);
  std::shared_ptr<cmGlobalGenerator>::operator=(&__return_storage_ptr__->GlobalGenerator,&local_70);
  std::shared_ptr<cmGlobalGenerator>::~shared_ptr(&local_70);
  cmState::CreateBaseSnapshot((cmStateSnapshot *)local_90,local_60);
  cmStateSnapshot::GetDirectory(&local_b8,(cmStateSnapshot *)local_90);
  cmStateDirectory::SetCurrentSource(&local_b8,currentSourceDirectory);
  cmStateSnapshot::GetDirectory(&local_e0,(cmStateSnapshot *)local_90);
  cmStateDirectory::SetCurrentBinary(&local_e0,currentBinaryDirectory);
  local_f8.State =
       (cmState *)
       std::__shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>::get
                 (&(__return_storage_ptr__->GlobalGenerator).
                   super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>);
  std::make_shared<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&local_f8.Position,&local_f8);
  std::shared_ptr<cmMakefile>::operator=
            (&__return_storage_ptr__->Makefile,(shared_ptr<cmMakefile> *)&local_f8.Position);
  std::shared_ptr<cmMakefile>::~shared_ptr((shared_ptr<cmMakefile> *)&local_f8.Position);
  this_00 = std::__shared_ptr_access<cmMakefile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cmMakefile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &__return_storage_ptr__->Makefile);
  cmMakefile::CreateNewTarget(this_00,targetName,EXECUTABLE,Yes,Normal);
  return __return_storage_ptr__;
}

Assistant:

static Dummies CreateDummies(
  std::string targetName,
  std::string currentSourceDirectory = "c:/CurrentSourceDirectory",
  std::string currentBinaryDirectory = "c:/CurrentBinaryDirectory")
{
  Dummies dummies;
  dummies.CMake =
    std::make_shared<cmake>(cmake::RoleProject, cmState::Project);
  cmState* state = dummies.CMake->GetState();
  dummies.GlobalGenerator =
    std::make_shared<cmGlobalGenerator>(dummies.CMake.get());
  cmStateSnapshot snapshot = state->CreateBaseSnapshot();
  snapshot.GetDirectory().SetCurrentSource(currentSourceDirectory);
  snapshot.GetDirectory().SetCurrentBinary(currentBinaryDirectory);
  dummies.Makefile =
    std::make_shared<cmMakefile>(dummies.GlobalGenerator.get(), snapshot);
  dummies.Makefile->CreateNewTarget(targetName, cmStateEnums::EXECUTABLE);
  return dummies;
}